

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * parse_string(cJSON *item,char *str)

{
  char *pcVar1;
  undefined8 in_RAX;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  size_t sVar9;
  uint uc;
  uint uc2;
  undefined8 local_38;
  int iVar5;
  
  pcVar1 = str;
  if (*str == '\"') {
    sVar9 = 1;
    pbVar7 = (byte *)(str + 1);
    for (pbVar2 = pbVar7; (bVar4 = *pbVar2, bVar4 != 0 && (bVar4 != 0x22));
        pbVar2 = pbVar2 + (ulong)(bVar4 == 0x5c) + 1) {
      sVar9 = sVar9 + 1;
    }
    local_38 = in_RAX;
    pbVar3 = (byte *)(*cJSON_malloc)(sVar9);
    pbVar2 = pbVar3;
    pcVar1 = ep;
    if (pbVar3 != (byte *)0x0) {
      do {
        bVar4 = *pbVar7;
        if (bVar4 == 0x5c) {
          bVar4 = pbVar7[1];
          switch(bVar4) {
          case 0x6e:
            *pbVar2 = 10;
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
switchD_0010b1e5_caseD_6f:
            *pbVar2 = bVar4;
            break;
          case 0x72:
            *pbVar2 = 0xd;
            break;
          case 0x74:
            *pbVar2 = 9;
            break;
          case 0x75:
            __isoc99_sscanf(pbVar7 + 2,"%4x",&local_38);
            pbVar8 = pbVar7 + 5;
            bVar4 = (byte)local_38;
            if ((uint)local_38 != 0 && ((uint)local_38 & 0xfffffc00) != 0xdc00) {
              if (((uint)local_38 & 0xfffffc00) == 0xd800) {
                if ((pbVar7[6] == 0x5c) && (pbVar7[7] == 0x75)) {
                  __isoc99_sscanf(pbVar7 + 8,"%4x",(long)&local_38 + 4);
                  pbVar8 = pbVar7 + 0xb;
                  if (0xfffffbff < local_38._4_4_ - 0xe000) {
                    iVar5 = ((uint)local_38 & 0x3bf) * 0x400 + (local_38._4_4_ & 0x3ff) + 0x10000;
                    bVar4 = (byte)iVar5;
                    local_38 = CONCAT44(local_38._4_4_,iVar5);
LAB_0010b2eb:
                    pbVar2[3] = bVar4 & 0x3f | 0x80;
                    bVar4 = (byte)((uint)local_38 >> 6);
                    local_38 = CONCAT44(local_38._4_4_,(uint)local_38 >> 6);
                    lVar6 = 4;
LAB_0010b303:
                    pbVar2[2] = bVar4 & 0x3f | 0x80;
                    bVar4 = (byte)((uint)local_38 >> 6);
                    local_38 = CONCAT44(local_38._4_4_,(uint)local_38 >> 6);
                    goto LAB_0010b316;
                  }
                }
              }
              else {
                lVar6 = 1;
                if (0x7f < (uint)local_38) {
                  lVar6 = 2;
                  if (0x7ff < (uint)local_38) {
                    lVar6 = 3;
                    if (0xffff < (uint)local_38) goto LAB_0010b2eb;
                    goto LAB_0010b303;
                  }
LAB_0010b316:
                  pbVar2[1] = bVar4 & 0x3f | 0x80;
                  bVar4 = (byte)((uint)local_38 >> 6);
                  local_38 = CONCAT44(local_38._4_4_,(uint)local_38 >> 6);
                }
                *pbVar2 = bVar4 | ""[lVar6];
                pbVar2 = pbVar2 + lVar6;
              }
            }
            goto LAB_0010b2b9;
          default:
            if (bVar4 == 0x66) {
              *pbVar2 = 0xc;
            }
            else {
              if (bVar4 != 0x62) goto switchD_0010b1e5_caseD_6f;
              *pbVar2 = 8;
            }
          }
          pbVar2 = pbVar2 + 1;
          pbVar8 = pbVar7 + 1;
        }
        else {
          if ((bVar4 == 0) || (bVar4 == 0x22)) {
            *pbVar2 = 0;
            bVar4 = *pbVar7;
            item->valuestring = (char *)pbVar3;
            item->type = 4;
            return (char *)(pbVar7 + (bVar4 == 0x22));
          }
          *pbVar2 = bVar4;
          pbVar2 = pbVar2 + 1;
          pbVar8 = pbVar7;
        }
LAB_0010b2b9:
        pbVar7 = pbVar8 + 1;
      } while( true );
    }
  }
  ep = pcVar1;
  return (char *)0x0;
}

Assistant:

static const char *parse_string(cJSON *item,const char *str)
{
	const char *ptr=str+1;char *ptr2;char *out;int len=0;unsigned uc,uc2;
	if (*str!='\"') {ep=str;return 0;}	/* not a string! */
	
	while (*ptr!='\"' && *ptr && ++len) if (*ptr++ == '\\') ptr++;	/* Skip escaped quotes. */
	
	out=(char*)cJSON_malloc(len+1);	/* This is how long we need for the string, roughly. */
	if (!out) return 0;
	
	ptr=str+1;ptr2=out;
	while (*ptr!='\"' && *ptr)
	{
		if (*ptr!='\\') *ptr2++=*ptr++;
		else
		{
			ptr++;
			switch (*ptr)
			{
				case 'b': *ptr2++='\b';	break;
				case 'f': *ptr2++='\f';	break;
				case 'n': *ptr2++='\n';	break;
				case 'r': *ptr2++='\r';	break;
				case 't': *ptr2++='\t';	break;
				case 'u':	 /* transcode utf16 to utf8. */
					sscanf(ptr+1,"%4x",&uc);ptr+=4;	/* get the unicode char. */

					if ((uc>=0xDC00 && uc<=0xDFFF) || uc==0)	break;	// check for invalid.

					if (uc>=0xD800 && uc<=0xDBFF)	// UTF16 surrogate pairs.
					{
						if (ptr[1]!='\\' || ptr[2]!='u')	break;	// missing second-half of surrogate.
						sscanf(ptr+3,"%4x",&uc2);ptr+=6;
						if (uc2<0xDC00 || uc2>0xDFFF)		break;	// invalid second-half of surrogate.
						uc=0x10000 | ((uc&0x3FF)<<10) | (uc2&0x3FF);
					}

					len=4;if (uc<0x80) len=1;else if (uc<0x800) len=2;else if (uc<0x10000) len=3; ptr2+=len;
					
					switch (len) {
						case 4: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 3: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 2: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 1: *--ptr2 =(uc | firstByteMark[len]);
					}
					ptr2+=len;
					break;
				default:  *ptr2++=*ptr; break;
			}
			ptr++;
		}
	}
	*ptr2=0;
	if (*ptr=='\"') ptr++;
	item->valuestring=out;
	item->type=cJSON_String;
	return ptr;
}